

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          shared_ptr<libtorrent::settings_pack> *a)

{
  io_context *ctx;
  __shared_ptr<libtorrent::settings_pack,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  shared_ptr<libtorrent::aux::session_impl> s;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [32];
  __shared_ptr<libtorrent::settings_pack,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,this);
  if (local_68._M_ptr != (element_type *)0x0) {
    ctx = (local_68._M_ptr)->m_io_context;
    ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)local_58,
               &local_68);
    local_58._16_8_ = f;
    local_58._24_8_ = a;
    ::std::__shared_ptr<libtorrent::settings_pack,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,in_RCX);
    boost::asio::
    dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&>(void(libtorrent::aux::session_impl::*)(std::shared_ptr<libtorrent::settings_pack>),std::shared_ptr<libtorrent::settings_pack>&)const::_lambda()_1_>
              (ctx,(type_conflict19 *)local_58,(type *)0x0);
    const::{lambda()#1}::~async_call((_lambda___1_ *)local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    return;
  }
  local_58._0_4_ = invalid_session_handle;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_58);
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}